

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

plutosvg_document_t * plutosvg_document_load_from_file(char *filename,float width,float height)

{
  FILE *__stream;
  size_t __size;
  char *data;
  size_t sVar1;
  plutosvg_document_t *ppVar2;
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __size = ftell(__stream);
    if ((__size != 0xffffffffffffffff) && (data = (char *)malloc(__size), data != (char *)0x0)) {
      fseek(__stream,0,0);
      sVar1 = fread(data,1,__size,__stream);
      fclose(__stream);
      if (sVar1 != __size) {
        free(data);
        return (plutosvg_document_t *)0x0;
      }
      ppVar2 = plutosvg_document_load_from_data(data,(int)__size,width,height,free,data);
      return ppVar2;
    }
    fclose(__stream);
  }
  return (plutosvg_document_t *)0x0;
}

Assistant:

plutosvg_document_t* plutosvg_document_load_from_file(const char* filename, float width, float height)
{
    FILE* fp = fopen(filename, "rb");
    if(fp == NULL) {
        return NULL;
    }

    fseek(fp, 0, SEEK_END);
    long length = ftell(fp);
    if(length == -1L) {
        fclose(fp);
        return NULL;
    }

    void* data = malloc(length);
    if(data == NULL) {
        fclose(fp);
        return NULL;
    }

    fseek(fp, 0, SEEK_SET);
    size_t nread = fread(data, 1, length, fp);
    fclose(fp);

    if(nread != length) {
        free(data);
        return NULL;
    }

    return plutosvg_document_load_from_data(data, length, width, height, free, data);
}